

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
insert<google::BaseHashtableInterface<google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
          (sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this)

{
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar1;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar2;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar3;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar4;
  pointer piVar5;
  iterator iVar6;
  long lVar7;
  undefined8 *puVar8;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  *ppVar9;
  difference_type __n;
  size_type delta;
  const_reference in_stack_00000028;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000060;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000068;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000070;
  pointer in_stack_00000078;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_80;
  
  piVar5 = in_stack_00000078;
  psVar4 = in_stack_00000070;
  psVar3 = in_stack_00000068;
  psVar2 = in_stack_00000060;
  puVar8 = (undefined8 *)&stack0x00000008;
  ppVar9 = &local_80;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    (ppVar9->first).ht =
         (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)*puVar8;
    puVar8 = puVar8 + 1;
    ppVar9 = (pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)&(ppVar9->first).pos;
  }
  lVar7 = 0;
  delta = 0;
  do {
    if ((((local_80.first.pos.row_begin._M_current == psVar2) &&
         (local_80.first.pos.row_end._M_current == psVar3)) &&
        (local_80.first.pos.row_current._M_current == psVar4)) &&
       ((local_80.first.pos.row_current._M_current == local_80.first.pos.row_end._M_current ||
        (local_80.first.pos.col_current == piVar5)))) {
      sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::resize_delta((sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)this,delta);
      if (delta != 0) {
        do {
          sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::insert_noresize(&local_80,
                            (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this,in_stack_00000028);
          const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator++((const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)&stack0x00000010);
          sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::advance_past_deleted
                    ((sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)&stack0x00000008);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0);
      }
      return;
    }
    local_80.first.pos.col_current = local_80.first.pos.col_current + 1;
    iVar6._M_current = local_80.first.pos.row_current._M_current;
    if (local_80.first.pos.col_current ==
        (local_80.first.pos.row_current._M_current)->group +
        ((local_80.first.pos.row_current._M_current)->settings).num_buckets) {
      do {
        iVar6._M_current = local_80.first.pos.row_current._M_current + 1;
        if (iVar6._M_current == local_80.first.pos.row_end._M_current) break;
        local_80.first.pos.col_current = (iVar6._M_current)->group;
        psVar1 = local_80.first.pos.row_current._M_current + 1;
        local_80.first.pos.row_current._M_current = iVar6._M_current;
      } while ((psVar1->settings).num_buckets == 0);
    }
    local_80.first.pos.row_current._M_current = iVar6._M_current;
    sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)&local_80);
    delta = delta + 1;
    lVar7 = lVar7 + -1;
  } while( true );
}

Assistant:

void insert(ForwardIterator f, ForwardIterator l, std::forward_iterator_tag) {
    size_t dist = std::distance(f, l);
    if (dist >= (std::numeric_limits<size_type>::max)()) {
      throw std::length_error("insert-range overflow");
    }
    resize_delta(static_cast<size_type>(dist));
    for (; dist > 0; --dist, ++f) {
      insert_noresize(*f);
    }
  }